

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::DataSink::DataSink(DataSink *this)

{
  DataSink *this_local;
  
  std::function<bool_(const_char_*,_unsigned_long)>::function(&this->write);
  std::function<void_()>::function(&this->done);
  std::
  function<void_(const_std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
  ::function(&this->done_with_trailer);
  std::ostream::ostream(&this->os,&(this->sb_).super_streambuf);
  data_sink_streambuf::data_sink_streambuf(&this->sb_,this);
  return;
}

Assistant:

DataSink() : os(&sb_), sb_(*this) {}